

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::BindDirectiveSyntax::BindDirectiveSyntax
          (BindDirectiveSyntax *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,
          Token bind,NameSyntax *target,BindTargetListSyntax *targetInstances,
          HierarchyInstantiationSyntax *instantiation)

{
  NameSyntax *pNVar1;
  HierarchyInstantiationSyntax *pHVar2;
  undefined8 uVar3;
  HierarchyInstantiationSyntax *local_38;
  
  uVar3 = bind._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,BindDirective,attributes);
  (this->bind).kind = (short)uVar3;
  (this->bind).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->bind).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->bind).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->bind).info = bind.info;
  local_38 = (HierarchyInstantiationSyntax *)target;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->target,(NameSyntax **)&local_38);
  this->targetInstances = targetInstances;
  local_38 = instantiation;
  not_null<slang::syntax::HierarchyInstantiationSyntax*>::
  not_null<slang::syntax::HierarchyInstantiationSyntax*,void>
            ((not_null<slang::syntax::HierarchyInstantiationSyntax*> *)&this->instantiation,
             &local_38);
  pNVar1 = not_null<slang::syntax::NameSyntax_*>::get(&this->target);
  (pNVar1->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  if (this->targetInstances != (BindTargetListSyntax *)0x0) {
    (this->targetInstances->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  pHVar2 = not_null<slang::syntax::HierarchyInstantiationSyntax_*>::get(&this->instantiation);
  (pHVar2->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

BindDirectiveSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token bind, NameSyntax& target, BindTargetListSyntax* targetInstances, HierarchyInstantiationSyntax& instantiation) :
        MemberSyntax(SyntaxKind::BindDirective, attributes), bind(bind), target(&target), targetInstances(targetInstances), instantiation(&instantiation) {
        this->target->parent = this;
        if (this->targetInstances) this->targetInstances->parent = this;
        this->instantiation->parent = this;
    }